

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O0

void h265e_dpb_set_ref_list(H265eDpb *dpb,H265eSlice *slice,RK_S32 delta_poc)

{
  H265eRefPicListModification *pHVar1;
  char *pcVar2;
  H265eRefPicListModification *refPicListModification;
  H265eReferencePictureSet *m_pRps;
  H265eRpsList *RpsList;
  int local_28;
  RK_S32 st_cnt;
  RK_S32 lt_cnt;
  RK_S32 ref_idx;
  RK_S32 i;
  RK_S32 delta_poc_local;
  H265eSlice *slice_local;
  H265eDpb *dpb_local;
  
  st_cnt = -1;
  local_28 = 0;
  RpsList._4_4_ = 0;
  pHVar1 = (dpb->RpsList).m_RefPicListModification;
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","enter\n","h265e_dpb_set_ref_list");
  }
  pHVar1->m_refPicListModificationFlagL0 = 0;
  pHVar1->m_refPicListModificationFlagL1 = 0;
  for (lt_cnt = 0; lt_cnt < 0x20; lt_cnt = lt_cnt + 1) {
    pHVar1->m_RefPicSetIdxL0[lt_cnt] = 0;
    pHVar1->m_RefPicSetIdxL0[lt_cnt] = 0;
  }
  pHVar1->m_refPicListModificationFlagL0 = 0;
  if (1 < (slice->m_localRPS).m_numberOfPictures) {
    for (lt_cnt = 0; lt_cnt < (slice->m_localRPS).m_numberOfPictures; lt_cnt = lt_cnt + 1) {
      if ((h265e_debug & 0x80) != 0) {
        _mpp_log_l(4,"h265e_dpb","m_pRps->delta_poc[%d] = %d",(char *)0x0,(ulong)(uint)lt_cnt,
                   (ulong)(uint)(slice->m_localRPS).delta_poc[lt_cnt]);
      }
      if ((slice->m_localRPS).delta_poc[lt_cnt] == delta_poc) {
        st_cnt = lt_cnt;
        if (((slice->m_localRPS).m_numberOfPictures - (slice->m_localRPS).num_long_term_pic) + -1 <
            lt_cnt) {
          local_28 = local_28 + 1;
        }
        else {
          RpsList._4_4_ = RpsList._4_4_ + 1;
        }
        if ((h265e_debug & 0x80) != 0) {
          pcVar2 = "lt";
          if (RpsList._4_4_ != 0) {
            pcVar2 = "st";
          }
          _mpp_log_l(4,"h265e_dpb","get %s ref ref_idx %d delta_poc %d",(char *)0x0,pcVar2,
                     (ulong)(uint)lt_cnt,delta_poc);
        }
      }
    }
    if ((local_28 != 1) && (RpsList._4_4_ == 0)) {
      _mpp_log_l(2,"h265e_dpb",
                 "Warning: Did not find the right long term reference picture or more than one.",
                 (char *)0x0);
      return;
    }
    if (st_cnt != 0) {
      pHVar1->m_refPicListModificationFlagL0 = 1;
      calc_ref_pic_set_idxl0(dpb,slice,st_cnt);
    }
  }
  pHVar1->m_refPicListModificationFlagL1 = 0;
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","leave\n","h265e_dpb_set_ref_list");
  }
  return;
}

Assistant:

void h265e_dpb_set_ref_list(H265eDpb *dpb, H265eSlice *slice, RK_S32 delta_poc)
{
    RK_S32 i;
    RK_S32 ref_idx = -1;
    RK_S32 lt_cnt = 0, st_cnt = 0;
    H265eRpsList *RpsList = &dpb->RpsList;
    H265eReferencePictureSet * m_pRps = (H265eReferencePictureSet*)&slice->m_localRPS;
    H265eRefPicListModification* refPicListModification = RpsList->m_RefPicListModification;

    h265e_dbg_func("enter\n");
    refPicListModification->m_refPicListModificationFlagL0 = 0;
    refPicListModification->m_refPicListModificationFlagL1 = 0;

    for (i = 0; i < REF_PIC_LIST_NUM_IDX; i ++) {
        refPicListModification->m_RefPicSetIdxL0[i] = 0;
        refPicListModification->m_RefPicSetIdxL0[i] = 0;
    }

    refPicListModification->m_refPicListModificationFlagL0 = 0;

    if (m_pRps->m_numberOfPictures > 1) {
        for (i = 0; i < m_pRps->m_numberOfPictures; i++) {
            h265e_dbg_dpb("m_pRps->delta_poc[%d] = %d", i, m_pRps->delta_poc[i]);
            if (m_pRps->delta_poc[i] == delta_poc) {
                ref_idx = i;
                if (i > m_pRps->m_numberOfPictures - m_pRps->num_long_term_pic - 1)
                    lt_cnt++;
                else
                    st_cnt++;
                h265e_dbg_dpb("get %s ref ref_idx %d delta_poc %d", st_cnt ? "st" : "lt", ref_idx, delta_poc);
            }
        }
        if (lt_cnt != 1 && st_cnt == 0) {
            mpp_err("Warning: Did not find the right long term reference picture or more than one.");
            return;
        } else if (ref_idx != 0) {
            refPicListModification->m_refPicListModificationFlagL0 = 1;
            calc_ref_pic_set_idxl0(dpb, slice, ref_idx);
        }
    }
    refPicListModification->m_refPicListModificationFlagL1 = 0;
    h265e_dbg_func("leave\n");
}